

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::ThreadData::try_consume_one(ThreadData *this)

{
  QueueTesterFlags QVar1;
  int64_t iVar2;
  function<void_()> local_38;
  anon_class_8_1_8991fb9c local_18;
  anon_class_8_1_8991fb9c consume_func;
  ThreadData *this_local;
  
  local_18.this = (ThreadData *)this;
  consume_func.this = (ThreadData *)this;
  QVar1 = operator&(*(QueueTesterFlags *)(this + 0x10),eTestExceptions);
  if (QVar1 == eTestExceptions) {
    std::function<void()>::
    function<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::ThreadData::try_consume_one()::_lambda()_1_&,void>
              ((function<void()> *)&local_38,&local_18);
    iVar2 = run_exception_test(&local_38);
    *(int64_t *)(this + 0x40) = iVar2 + *(long *)(this + 0x40);
    std::function<void_()>::~function(&local_38);
  }
  else {
    try_consume_one::anon_class_8_1_8991fb9c::operator()(&local_18);
  }
  return;
}

Assistant:

void try_consume_one()
            {
                auto consume_func = [&] {
                    if (m_random.get_bool())
                    {
                        if (auto consume = m_queue.try_start_consume())
                        {
                            // find the type to get the index
                            auto const type    = consume.complete_type();
                            auto const type_it = m_parent_tester.m_element_types.find(type);
                            DENSITY_TEST_ASSERT(type_it != m_parent_tester.m_element_types.end());

                            // call the user-provided callback
                            auto const type_index = type_it->second;
                            (*m_parent_tester.m_consume_cases[type_index])(consume);

                            // in case of exception the element is not consumed (because we don't call commit)
                            exception_checkpoint();

                            // done! From now on no exception can occur
                            consume.commit();
                            m_final_stats.m_counters[type_index].m_existing--;
                            m_consumes_committed++;
                        }
                    }
                    else
                    {
                        if (auto consume = m_queue.try_start_reentrant_consume())
                        {
                            // find the type to get the index
                            auto const type    = consume.complete_type();
                            auto const type_it = m_parent_tester.m_element_types.find(type);
                            DENSITY_TEST_ASSERT(type_it != m_parent_tester.m_element_types.end());

                            // call the user-provided callback
                            auto const type_index = type_it->second;
                            (*m_parent_tester.m_reentrant_consume_cases[type_index])(consume);

                            // in case of exception the element is not consumed (because we don't call commit)
                            exception_checkpoint();

                            m_pending_reentrant_consumes.push_back(
                              ReentrantConsume(type_index, std::move(consume)));
                        }
                    }
                };

                if (
                  (m_flags & QueueTesterFlags::eTestExceptions) ==
                  QueueTesterFlags::eTestExceptions)
                {
                    m_final_stats.m_exceptions_during_consumes += run_exception_test(consume_func);
                }
                else
                {
                    consume_func();
                }
            }